

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase228::run(TestCase228 *this)

{
  Exception *pEVar1;
  long *plVar2;
  undefined8 uVar3;
  PipelineOp *pPVar4;
  CapTableBuilder *pCVar5;
  RequestHook *pRVar6;
  AsyncIoStream *pAVar7;
  AsyncIoProvider *pAVar8;
  char *pcVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t __n;
  undefined8 uVar13;
  Disposer *pDVar14;
  void *__buf;
  void *__buf_00;
  Exception *exception;
  Disposer *pDVar15;
  int iVar16;
  Disposer *disposerCopy;
  Client CVar17;
  Own<capnp::ClientHook> OVar18;
  ReaderOptions receiveOptions;
  int handleCount;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> promise;
  Disposer *disposerCopy_1;
  Fault f;
  PipeThread serverThread;
  AsyncIoContext ioContext;
  Client client;
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  int callCount;
  TwoPartyVatNetwork network;
  int local_48c;
  long *local_488;
  undefined1 local_480 [32];
  PipelineOp *local_460;
  Disposer *pDStack_458;
  ArrayDisposer *local_450;
  long *local_448;
  SegmentBuilder *local_440;
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  local_438;
  PipeThread local_400;
  undefined8 *local_3e0;
  long *local_3d8;
  undefined8 *local_3d0;
  AsyncIoProvider *local_3c8;
  WaitScope *local_3c0;
  pointer_____offset_0x10___ *local_3b0;
  undefined1 local_3a8 [8];
  char *pcStack_3a0;
  NullableValue<kj::Exception> local_398;
  char local_238;
  RpcSystemBase local_228;
  int local_214;
  undefined1 local_210 [24];
  Disposer *local_1f8;
  ArrayDisposer *local_1f0;
  int local_1e8;
  Maybe<capnp::MessageSize> local_1e0;
  Maybe<capnp::MessageSize> local_1c8;
  TwoPartyVatNetwork local_1b0;
  
  kj::setupAsyncIo();
  local_214 = 0;
  local_48c = 0;
  runServer(&local_400,local_3c8,&local_214,&local_48c);
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  iVar16 = 0x40;
  __n = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&local_1b0,local_400.pipe.ptr,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&local_228,&local_1b0.super_TwoPartyVatNetworkBase);
  CVar17 = getPersistentCap((RpcSystem<capnp::rpc::twoparty::VatId> *)local_480,(Side)&local_228,
                            TEST_MORE_STUFF);
  (*((BootstrapFactoryBase *)local_480._8_8_)->_vptr_BootstrapFactoryBase[4])
            ((ExceptionOrValue *)&local_398,local_480._8_8_,CVar17.hook.ptr);
  uVar13 = local_480._8_8_;
  local_3a8._0_4_ = local_398._0_4_;
  local_3a8._4_4_ = local_398._4_4_;
  pcStack_3a0 = local_398.field_1.value.ownFile.content.ptr;
  local_3b0 = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  if ((Impl *)local_480._8_8_ != (Impl *)0x0) {
    local_480._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_480._0_8_)->arena->_vptr_Arena)
              (local_480._0_8_,
               (_func_int *)
               ((long)&((BootstrapFactoryBase *)uVar13)->_vptr_BootstrapFactoryBase +
               (long)((BootstrapFactoryBase *)uVar13)->_vptr_BootstrapFactoryBase[-2]));
  }
  local_1c8.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::getHandleRequest
            (&local_438,(Client *)&local_3b0,&local_1c8);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
          *)local_480,(int)&local_438,__buf,__n,iVar16);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>
              *)&local_398,local_480);
  if (local_398.field_1._28_2_ == 0) {
    local_1e8 = 0x7fffffff;
    uVar13 = (Disposer *)0x0;
    local_1f0 = (ArrayDisposer *)0x0;
    local_210._16_8_ = (SegmentBuilder *)0x0;
  }
  else {
    uVar13 = local_398.field_1.value.ownFile.content.ptr;
    local_1f0 = local_398.field_1.value.ownFile.content.disposer;
    local_210._16_8_ = local_398._0_8_;
    local_1e8 = local_398.field_1.value.line;
  }
  local_1f8 = (Disposer *)uVar13;
  OVar18 = PointerReader::getCapability((PointerReader *)local_210);
  uVar3 = local_398.field_1.value.description.content.size_;
  if ((long *)local_398.field_1.value.description.content.size_ != (long *)0x0) {
    local_398.field_1.value.description.content.size_ = 0;
    (*(code *)**(undefined8 **)local_398.field_1.value.description.content.ptr)
              (local_398.field_1.value.description.content.ptr,
               uVar3 + *(long *)(*(long *)uVar3 + -0x10),OVar18.ptr);
  }
  pDVar14 = pDStack_458;
  pPVar4 = local_460;
  if (local_460 != (PipelineOp *)0x0) {
    local_460 = (PipelineOp *)0x0;
    pDStack_458 = (Disposer *)0x0;
    pDVar15 = pDVar14;
    (**local_450->_vptr_ArrayDisposer)(local_450,pPVar4,8,pDVar14,pDVar14,0);
    iVar16 = (int)pDVar15;
    uVar13 = pDVar14;
  }
  uVar3 = local_480._24_8_;
  if ((WirePointer *)local_480._24_8_ != (WirePointer *)0x0) {
    local_480._24_8_ = (WirePointer *)0x0;
    (***(_func_int ***)local_480._16_8_)
              (local_480._16_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar3)->value +
               *(long *)((long)*(WirePointer *)uVar3 + -0x10));
  }
  uVar3 = local_480._8_8_;
  if ((Impl *)local_480._8_8_ != (Impl *)0x0) {
    local_480._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_480._0_8_)->arena->_vptr_Arena)
              (local_480._0_8_,
               (_func_int *)
               ((long)&((BootstrapFactoryBase *)uVar3)->_vptr_BootstrapFactoryBase +
               (long)((BootstrapFactoryBase *)uVar3)->_vptr_BootstrapFactoryBase[-2]));
  }
  pRVar6 = local_438.hook.ptr;
  if (local_438.hook.ptr != (RequestHook *)0x0) {
    local_438.hook.ptr = (RequestHook *)0x0;
    (**(local_438.hook.disposer)->_vptr_Disposer)
              (local_438.hook.disposer,
               (_func_int *)((long)&pRVar6->_vptr_RequestHook + (long)pRVar6->_vptr_RequestHook[-2])
              );
  }
  local_1e0.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::getHandleRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
              *)&local_398,(Client *)&local_3b0,&local_1e0);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
          *)local_480,(int)(ExceptionOrValue *)&local_398,__buf_00,uVar13,iVar16);
  uVar13 = local_398.field_1.value.description.content.ptr;
  if ((long *)local_398.field_1.value.description.content.ptr != (long *)0x0) {
    local_398.field_1.value.description.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_398.field_1._32_8_)
              (local_398.field_1._32_8_,
               (char *)(uVar13 + *(long *)(*(long *)uVar13 + 0xfffffffffffffff0)));
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>
              *)&local_398,local_480);
  local_438.super_Builder._builder.capTable =
       (CapTableBuilder *)local_398.field_1.value.ownFile.content.ptr;
  local_438.super_Builder._builder.segment = (SegmentBuilder *)local_398._0_8_;
  if (local_398.field_1._28_2_ == 0) {
    local_398.field_1.value.line = 0x7fffffff;
    local_398.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x0;
    local_438.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    local_438.super_Builder._builder.segment = (SegmentBuilder *)0x0;
  }
  local_438.super_Builder._builder.data = local_398.field_1.value.ownFile.content.disposer;
  local_438.super_Builder._builder.pointers._0_4_ = local_398.field_1.value.line;
  OVar18 = PointerReader::getCapability((PointerReader *)(local_210 + 0x10));
  pDVar14 = local_1f8;
  uVar13 = local_398.field_1.value.description.content.size_;
  local_440 = (SegmentBuilder *)local_210._16_8_;
  if ((long *)local_398.field_1.value.description.content.size_ != (long *)0x0) {
    local_398.field_1.value.description.content.size_ = 0;
    (*(code *)**(undefined8 **)local_398.field_1.value.description.content.ptr)
              (local_398.field_1.value.description.content.ptr,
               uVar13 + *(long *)(*(long *)uVar13 + -0x10),OVar18.ptr);
  }
  if ((local_48c != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_398._0_4_ = 2;
    kj::_::Debug::log<char_const(&)[38],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xf5,ERROR,"\"failed: expected \" \"(2) == (handleCount)\", 2, handleCount",
               (char (*) [38])"failed: expected (2) == (handleCount)",(int *)&local_398,&local_48c);
  }
  Capability::Client::Client
            ((Client *)&(((ExceptionOrValue *)&local_398)->exception).ptr.field_1.value,(void *)0x0)
  ;
  local_448 = (long *)local_398.field_1.value.ownFile.content.size_;
  uVar13 = local_398.field_1.value.ownFile.content.ptr;
  local_398._0_8_ = &capnproto_test::capnp::test::TestHandle::Client::typeinfo;
  local_398.field_1.value.ownFile.content.size_ = 0;
  if ((CapTableReader *)local_210._8_8_ != (CapTableReader *)0x0) {
    (*(code *)(*(Arena **)local_210._0_8_)->_vptr_Arena)
              (local_210._0_8_,
               (_func_int *)
               ((long)(_func_int ***)local_210._8_8_ + (long)(*(_func_int ***)local_210._8_8_)[-2]))
    ;
  }
  if ((long *)local_398.field_1.value.ownFile.content.size_ != (long *)0x0) {
    local_398.field_1.value.ownFile.content.size_ = 0;
    (*(code *)**(undefined8 **)local_398.field_1.value.ownFile.content.ptr)();
  }
  pEVar1 = (Exception *)&(((ExceptionOrValue *)&local_398)->exception).ptr.field_1;
  iVar16 = -1000;
  do {
    if (local_48c < 2) {
      if ((local_48c != 1) && (kj::_::Debug::minSeverity < 3)) {
        local_398._0_4_ = 1;
        kj::_::Debug::log<char_const(&)[38],int,int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                   ,0x109,ERROR,"\"failed: expected \" \"(1) == (handleCount)\", 1, handleCount",
                   (char (*) [38])"failed: expected (1) == (handleCount)",(int *)&local_398,
                   &local_48c);
      }
      Capability::Client::Client
                ((Client *)&(((ExceptionOrValue *)&local_398)->exception).ptr.field_1.value,
                 (void *)0x0);
      uVar3 = local_398.field_1.value.ownFile.content.ptr;
      local_398._0_8_ = &capnproto_test::capnp::test::TestHandle::Client::typeinfo;
      local_488 = (long *)local_398.field_1.value.ownFile.content.size_;
      local_398.field_1.value.ownFile.content.size_ = 0;
      if (pDVar14 != (Disposer *)0x0) {
        (*(code *)((local_440->super_SegmentReader).arena)->_vptr_Arena)
                  (local_440,
                   (_func_int *)((long)&pDVar14->_vptr_Disposer + (long)pDVar14->_vptr_Disposer[-2])
                  );
      }
      uVar10 = local_398.field_1.value.ownFile.content.size_;
      if ((long *)local_398.field_1.value.ownFile.content.size_ != (long *)0x0) {
        local_398.field_1.value.ownFile.content.size_ = 0;
        local_440 = (SegmentBuilder *)uVar3;
        (*(code *)**(undefined8 **)local_398.field_1.value.ownFile.content.ptr)
                  (local_398.field_1.value.ownFile.content.ptr,
                   uVar10 + *(long *)(*(long *)uVar10 + -0x10));
      }
      iVar12 = (*local_3c8->_vptr_AsyncIoProvider[5])();
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar12) + 0x10))
                (&local_438,(long *)CONCAT44(extraout_var_00,iVar12),10000000);
      local_398._0_8_ = local_398._0_8_ & 0xffffffffffffff00;
      local_238 = '\0';
      kj::_::waitImpl((Own<kj::_::PromiseNode> *)&local_438,(ExceptionOrValue *)&local_398,local_3c0
                     );
      if (local_238 == '\x01') {
        if (local_398.isSet != false) {
          kj::throwRecoverableException
                    ((Exception *)&(((ExceptionOrValue *)&local_398)->exception).ptr.field_1,0);
        }
      }
      else {
        if (local_398.isSet == false) {
          kj::_::unreachable();
        }
        kj::throwRecoverableException
                  ((Exception *)&(((ExceptionOrValue *)&local_398)->exception).ptr.field_1,0);
      }
      if (local_398.isSet == true) {
        kj::Exception::~Exception
                  ((Exception *)&(((ExceptionOrValue *)&local_398)->exception).ptr.field_1);
      }
      pCVar5 = local_438.super_Builder._builder.capTable;
      if (local_438.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
        local_438.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
        (*(code *)(((local_438.super_Builder._builder.segment)->super_SegmentReader).arena)->
                  _vptr_Arena)
                  (local_438.super_Builder._builder.segment,
                   (_func_int *)
                   ((long)&(pCVar5->super_CapTableReader)._vptr_CapTableReader +
                   (long)(pCVar5->super_CapTableReader)._vptr_CapTableReader[-2]));
      }
      if ((local_48c != 1) && (kj::_::Debug::minSeverity < 3)) {
        local_398._0_4_ = 1;
        kj::_::Debug::log<char_const(&)[38],int,int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                   ,0x10e,ERROR,"\"failed: expected \" \"(1) == (handleCount)\", 1, handleCount",
                   (char (*) [38])"failed: expected (1) == (handleCount)",(int *)&local_398,
                   &local_48c);
      }
      local_398.field_1.value.file = (char *)0x0;
      local_398.field_1._32_8_ = 0;
      local_398.field_1.value.ownFile.content.size_ = 0;
      local_398.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x0;
      local_398._0_8_ = (SegmentBuilder *)0x0;
      local_398.field_1.value.ownFile.content.ptr = (char *)0x0;
      local_398.field_1.value.description.content.ptr = (char *)0x0;
      RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::operator=
                ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *)
                 local_480,
                 (RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *)
                 &local_398);
      uVar11 = local_398.field_1._32_8_;
      uVar10 = local_398.field_1.value.file;
      if (local_398.field_1.value.file != (char *)0x0) {
        local_398.field_1.value.file = (char *)0x0;
        local_398.field_1._32_8_ = 0;
        (*(code *)**(undefined8 **)local_398.field_1.value.description.content.ptr)
                  (local_398.field_1.value.description.content.ptr,uVar10,8,uVar11,uVar11,0);
      }
      uVar10 = local_398.field_1.value.ownFile.content.disposer;
      if (local_398.field_1.value.ownFile.content.disposer != (ArrayDisposer *)0x0) {
        local_398.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x0;
        (*(code *)**(undefined8 **)local_398.field_1.value.ownFile.content.size_)
                  (local_398.field_1.value.ownFile.content.size_,
                   (_func_int *)
                   ((long)&((ArrayDisposer *)uVar10)->_vptr_ArrayDisposer +
                   (long)((ArrayDisposer *)uVar10)->_vptr_ArrayDisposer[0xfffffffffffffffe]));
      }
      uVar10 = local_398.field_1.value.ownFile.content.ptr;
      if ((long *)local_398.field_1.value.ownFile.content.ptr != (long *)0x0) {
        local_398.field_1.value.ownFile.content.ptr = (char *)0x0;
        (*(code *)((SegmentReader *)local_398._0_8_)->arena->_vptr_Arena)
                  (local_398._0_8_,
                   (char *)(uVar10 + *(long *)(*(long *)uVar10 + 0xfffffffffffffff0)));
      }
      pEVar1 = (Exception *)&(((ExceptionOrValue *)&local_398)->exception).ptr.field_1;
      do {
        plVar2 = local_488;
        if (local_48c < 1) {
          if ((local_48c != 0) && (kj::_::Debug::minSeverity < 3)) {
            local_398._0_8_ = local_398._0_8_ & 0xffffffff00000000;
            kj::_::Debug::log<char_const(&)[38],int,int&>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                       ,0x116,ERROR,"\"failed: expected \" \"(0) == (handleCount)\", 0, handleCount"
                       ,(char (*) [38])"failed: expected (0) == (handleCount)",(int *)&local_398,
                       &local_48c);
          }
          if (plVar2 != (long *)0x0) {
            (*(code *)**(undefined8 **)uVar3)(uVar3,(long)plVar2 + *(long *)(*plVar2 + -0x10));
          }
          pDVar14 = pDStack_458;
          pPVar4 = local_460;
          if (local_460 != (PipelineOp *)0x0) {
            local_460 = (PipelineOp *)0x0;
            pDStack_458 = (Disposer *)0x0;
            (**local_450->_vptr_ArrayDisposer)(local_450,pPVar4,8,pDVar14,pDVar14,0);
          }
          uVar3 = local_480._24_8_;
          if ((WirePointer *)local_480._24_8_ != (WirePointer *)0x0) {
            local_480._24_8_ = (WirePointer *)0x0;
            (***(_func_int ***)local_480._16_8_)
                      (local_480._16_8_,
                       (long)&((WireValue<uint32_t>_conflict *)uVar3)->value +
                       *(long *)((long)*(WirePointer *)uVar3 + -0x10));
          }
          plVar2 = local_448;
          uVar3 = local_480._8_8_;
          if ((Impl *)local_480._8_8_ != (Impl *)0x0) {
            local_480._8_8_ = (Impl *)0x0;
            (*(code *)((SegmentReader *)local_480._0_8_)->arena->_vptr_Arena)
                      (local_480._0_8_,
                       (_func_int *)
                       ((long)&((BootstrapFactoryBase *)uVar3)->_vptr_BootstrapFactoryBase +
                       (long)((BootstrapFactoryBase *)uVar3)->_vptr_BootstrapFactoryBase[-2]));
          }
          if (plVar2 != (long *)0x0) {
            (*(code *)**(undefined8 **)uVar13)(uVar13,(long)plVar2 + *(long *)(*plVar2 + -0x10));
          }
          pcVar9 = pcStack_3a0;
          if (pcStack_3a0 != (char *)0x0) {
            pcStack_3a0 = (char *)0x0;
            (*(code *)**(undefined8 **)CONCAT44(local_3a8._4_4_,local_3a8._0_4_))
                      ((undefined8 *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_),
                       pcVar9 + *(long *)(*(long *)pcVar9 + -0x10));
          }
          RpcSystemBase::~RpcSystemBase(&local_228);
          TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_1b0);
          pAVar7 = local_400.pipe.ptr;
          if (local_400.pipe.ptr != (AsyncIoStream *)0x0) {
            local_400.pipe.ptr = (AsyncIoStream *)0x0;
            (**(local_400.pipe.disposer)->_vptr_Disposer)
                      (local_400.pipe.disposer,
                       (_func_int *)
                       ((long)&(pAVar7->super_AsyncInputStream)._vptr_AsyncInputStream +
                       (long)(pAVar7->super_AsyncInputStream)._vptr_AsyncInputStream[-2]));
          }
          if (local_400.thread.ptr != (Thread *)0x0) {
            local_400.thread.ptr = (Thread *)0x0;
            (**(local_400.thread.disposer)->_vptr_Disposer)();
          }
          pAVar8 = local_3c8;
          if (local_3c8 != (AsyncIoProvider *)0x0) {
            local_3c8 = (AsyncIoProvider *)0x0;
            (**(code **)*local_3d0)
                      (local_3d0,
                       (_func_int *)
                       ((long)&pAVar8->_vptr_AsyncIoProvider +
                       (long)pAVar8->_vptr_AsyncIoProvider[-2]));
          }
          plVar2 = local_3d8;
          if (local_3d8 != (long *)0x0) {
            local_3d8 = (long *)0x0;
            (**(code **)*local_3e0)(local_3e0,(long)plVar2 + *(long *)(*plVar2 + -0x10));
          }
          return;
        }
        iVar12 = (*local_3c8->_vptr_AsyncIoProvider[5])();
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar12) + 0x10))
                  (&local_438,(long *)CONCAT44(extraout_var_01,iVar12),10000000);
        local_398._0_8_ = local_398._0_8_ & 0xffffffffffffff00;
        local_238 = '\0';
        kj::_::waitImpl((Own<kj::_::PromiseNode> *)&local_438,(ExceptionOrValue *)&local_398,
                        local_3c0);
        if (local_238 == '\x01') {
          if (local_398.isSet != false) {
            kj::throwRecoverableException(pEVar1,0);
          }
        }
        else {
          if (local_398.isSet == false) {
            kj::_::unreachable();
          }
          kj::throwRecoverableException(pEVar1,0);
        }
        if (local_398.isSet == true) {
          kj::Exception::~Exception(pEVar1);
        }
        pCVar5 = local_438.super_Builder._builder.capTable;
        if (local_438.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
          local_438.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
          (*(code *)(((local_438.super_Builder._builder.segment)->super_SegmentReader).arena)->
                    _vptr_Arena)
                    (local_438.super_Builder._builder.segment,
                     (_func_int *)
                     ((long)&(pCVar5->super_CapTableReader)._vptr_CapTableReader +
                     (long)(pCVar5->super_CapTableReader)._vptr_CapTableReader[-2]));
        }
        iVar16 = iVar16 + 1;
      } while (iVar16 != 0);
      local_438.super_Builder._builder.segment = (SegmentBuilder *)0x0;
      local_398._0_8_ = (SegmentBuilder *)0x0;
      local_398.field_1.value.ownFile.content.ptr = (char *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_438,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_438);
    }
    iVar12 = (*local_3c8->_vptr_AsyncIoProvider[5])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar12) + 0x10))
              (&local_438,(long *)CONCAT44(extraout_var,iVar12),10000000);
    local_398._0_8_ = local_398._0_8_ & 0xffffffffffffff00;
    local_238 = '\0';
    kj::_::waitImpl((Own<kj::_::PromiseNode> *)&local_438,(ExceptionOrValue *)&local_398,local_3c0);
    if (local_238 == '\x01') {
      if (local_398.isSet != false) {
        kj::throwRecoverableException(pEVar1,0);
      }
    }
    else {
      if (local_398.isSet == false) {
        kj::_::unreachable();
      }
      kj::throwRecoverableException(pEVar1,0);
    }
    if (local_398.isSet == true) {
      kj::Exception::~Exception(pEVar1);
    }
    if (local_438.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
      local_438.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_438.super_Builder._builder.segment)->super_SegmentReader).arena)->
                _vptr_Arena)();
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 != 0);
  local_438.super_Builder._builder.segment = (SegmentBuilder *)0x0;
  local_398._0_8_ = (SegmentBuilder *)0x0;
  local_398.field_1.value.ownFile.content.ptr = (char *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_438,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_438);
}

Assistant:

TEST(TwoPartyNetwork, Release) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  // Request the particular capability from the server.
  auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
      test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF).castAs<test::TestMoreStuff>();

  auto handle1 = client.getHandleRequest().send().wait(ioContext.waitScope).getHandle();
  auto promise = client.getHandleRequest().send();
  auto handle2 = promise.wait(ioContext.waitScope).getHandle();

  EXPECT_EQ(2, handleCount);

  handle1 = nullptr;

  // There once was a bug where the last outgoing message (and any capabilities attached) would
  // not get cleaned up (until a new message was sent). This appeared to be a bug in Release,
  // becaues if a client received a message and then released a capability from it but then did
  // not make any further calls, then the capability would not be released because the message
  // introducing it remained the last server -> client message (because a "Release" message has
  // no reply). Here we are explicitly trying to catch this bug. This proves tricky, because when
  // we drop a reference on the client side, there's no particular way to wait for the release
  // message to reach the server except to make a subsequent call and wait for the return -- but
  // that would mask the bug. So, we wait spin waiting for handleCount to change.

  uint maxSpins = 1000;

  while (handleCount > 1) {
    ioContext.provider->getTimer().afterDelay(10 * kj::MILLISECONDS).wait(ioContext.waitScope);
    KJ_ASSERT(--maxSpins > 0);
  }
  EXPECT_EQ(1, handleCount);

  handle2 = nullptr;

  ioContext.provider->getTimer().afterDelay(10 * kj::MILLISECONDS).wait(ioContext.waitScope);
  EXPECT_EQ(1, handleCount);

  promise = nullptr;

  while (handleCount > 0) {
    ioContext.provider->getTimer().afterDelay(10 * kj::MILLISECONDS).wait(ioContext.waitScope);
    KJ_ASSERT(--maxSpins > 0);
  }
  EXPECT_EQ(0, handleCount);
}